

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenMemoryCopySetSize(BinaryenExpressionRef expr,BinaryenExpressionRef sizeExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef sizeExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::MemoryCopy>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<MemoryCopy>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xdfa,
                  "void BinaryenMemoryCopySetSize(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (sizeExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = sizeExpr;
    return;
  }
  __assert_fail("sizeExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xdfb,
                "void BinaryenMemoryCopySetSize(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenMemoryCopySetSize(BinaryenExpressionRef expr,
                               BinaryenExpressionRef sizeExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<MemoryCopy>());
  assert(sizeExpr);
  static_cast<MemoryCopy*>(expression)->size = (Expression*)sizeExpr;
}